

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ExpressionFilter::Deserialize(ExpressionFilter *this,Deserializer *deserializer)

{
  ExpressionFilter *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  Expression *local_18;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)&stack0xffffffffffffffe8,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (ExpressionFilter *)operator_new(0x18);
  local_20._M_head_impl = local_18;
  local_18 = (Expression *)0x0;
  ExpressionFilter(this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_20._M_head_impl = (Expression *)0x0;
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  if (local_18 != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_18 + 8))();
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ExpressionFilter::Deserialize(Deserializer &deserializer) {
	auto expr = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "expr");
	auto result = duckdb::unique_ptr<ExpressionFilter>(new ExpressionFilter(std::move(expr)));
	return std::move(result);
}